

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::BuilderTest_build_histogram_Test::TestBody
          (BuilderTest_build_histogram_Test *this)

{
  initializer_list<double> __l;
  Builder<prometheus::Histogram> *pBVar1;
  Family<prometheus::Histogram> *this_00;
  allocator<double> local_d1;
  double local_d0 [2];
  iterator local_c0;
  size_type local_b8;
  vector<double,_std::allocator<double>_> local_b0;
  Builder<prometheus::Histogram> local_88;
  Family<prometheus::Histogram> *local_18;
  Family<prometheus::Histogram> *family;
  BuilderTest_build_histogram_Test *this_local;
  
  family = (Family<prometheus::Histogram> *)this;
  BuildHistogram();
  pBVar1 = detail::Builder<prometheus::Histogram>::Name(&local_88,&(this->super_BuilderTest).name);
  pBVar1 = detail::Builder<prometheus::Histogram>::Help(pBVar1,&(this->super_BuilderTest).help);
  pBVar1 = detail::Builder<prometheus::Histogram>::Labels
                     (pBVar1,&(this->super_BuilderTest).const_labels);
  this_00 = detail::Builder<prometheus::Histogram>::Register
                      (pBVar1,&(this->super_BuilderTest).registry);
  detail::Builder<prometheus::Histogram>::~Builder(&local_88);
  local_d0[0] = 1.0;
  local_d0[1] = 2.0;
  local_c0 = local_d0;
  local_b8 = 2;
  local_18 = this_00;
  std::allocator<double>::allocator(&local_d1);
  __l._M_len = local_b8;
  __l._M_array = local_c0;
  std::vector<double,_std::allocator<double>_>::vector(&local_b0,__l,&local_d1);
  Family<prometheus::Histogram>::Add<std::vector<double,std::allocator<double>>>
            (this_00,&(this->super_BuilderTest).more_labels,&local_b0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_b0);
  std::allocator<double>::~allocator(&local_d1);
  BuilderTest::verifyCollectedLabels(&this->super_BuilderTest);
  return;
}

Assistant:

TEST_F(BuilderTest, build_histogram) {
  auto& family = BuildHistogram()
                     .Name(name)
                     .Help(help)
                     .Labels(const_labels)
                     .Register(registry);
  family.Add(more_labels, Histogram::BucketBoundaries{1, 2});

  verifyCollectedLabels();
}